

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

FPolyObj * __thiscall FPolyMirrorIterator::NextMirror(FPolyMirrorIterator *this)

{
  uint polyNum;
  uint uVar1;
  FPolyObj *pFVar2;
  FPolyObj *pFVar3;
  FPolyObj *pFVar4;
  long lVar5;
  
  pFVar2 = this->CurPoly;
  if (pFVar2 == (FPolyObj *)0x0) {
    return (FPolyObj *)0x0;
  }
  polyNum = pFVar2->MirrorNum;
  if (polyNum != 0) {
    uVar1 = this->NumUsedPolys;
    lVar5 = (long)(int)uVar1;
    pFVar4 = (FPolyObj *)0x0;
    if (lVar5 == 100) goto LAB_00469e31;
    pFVar3 = (FPolyObj *)0x0;
    if (0 < (int)uVar1) {
      pFVar3 = (FPolyObj *)(ulong)uVar1;
    }
    for (; pFVar3 != pFVar4; pFVar4 = (FPolyObj *)((long)&(pFVar4->Sidedefs).Array + 1)) {
      if (this->UsedPolys[(long)pFVar4] == polyNum) {
        pFVar3 = (FPolyObj *)((ulong)pFVar4 & 0xffffffff);
        break;
      }
    }
    if ((uint)pFVar3 == uVar1) {
      this->NumUsedPolys = uVar1 + 1;
      this->UsedPolys[lVar5] = polyNum;
      pFVar4 = PO_GetPolyobj(polyNum);
      if (pFVar4 == (FPolyObj *)0x0) {
        pFVar4 = (FPolyObj *)0x0;
        Printf("Invalid mirror polyobj num %d for polyobj num %d\n",(ulong)polyNum,
               (ulong)(uint)this->UsedPolys[lVar5 + -1]);
      }
      goto LAB_00469e31;
    }
  }
  pFVar4 = (FPolyObj *)0x0;
LAB_00469e31:
  this->CurPoly = pFVar4;
  return pFVar2;
}

Assistant:

FPolyObj *FPolyMirrorIterator::NextMirror()
{
	FPolyObj *poly = CurPoly, *nextpoly;

	if (poly == NULL)
	{
		return NULL;
	}

	// Do the work to decide which polyobject to return the next time this
	// function is called.
	int mirror = poly->GetMirror(), i;
	nextpoly = NULL;

	// Is there a mirror and we have room to remember it?
	if (mirror != 0 && NumUsedPolys != countof(UsedPolys))
	{
		// Has this polyobject been returned already?
		for (i = 0; i < NumUsedPolys; ++i)
		{
			if (UsedPolys[i] == mirror)
			{
				break;	// Yes, it has been returned.
			}
		}
		if (i == NumUsedPolys)
		{ // No, it has not been returned.
			UsedPolys[NumUsedPolys++] = mirror;
			nextpoly = PO_GetPolyobj(mirror);
			if (nextpoly == NULL)
			{
				Printf("Invalid mirror polyobj num %d for polyobj num %d\n", mirror, UsedPolys[i - 1]);
			}
		}
	}
	CurPoly = nextpoly;
	return poly;
}